

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  char *ptr;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar8;
  
  auVar2 = _DAT_00165e40;
  uVar3 = (ulong)(uint)(ctx->Tables).Buf.Size;
  if (uVar3 != 0) {
    pIVar1 = (ctx->Tables).Buf.Data;
    lVar4 = uVar3 - 1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    auVar5 = auVar5 ^ _DAT_00165e40;
    auVar7 = _DAT_00165e20;
    auVar9 = _DAT_00165e30;
    do {
      auVar10 = auVar9 ^ auVar2;
      iVar6 = auVar5._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar6 && auVar5._0_4_ < auVar10._0_4_ || iVar6 < auVar10._4_4_)
                & 1)) {
        *(undefined4 *)((long)pIVar1->RowBgColor + lVar4 + -0x34) = 0xffffffff;
      }
      if ((auVar10._12_4_ != auVar5._12_4_ || auVar10._8_4_ <= auVar5._8_4_) &&
          auVar10._12_4_ <= auVar5._12_4_) {
        *(undefined4 *)((long)pIVar1[1].RowBgColor + lVar4 + -0x34) = 0xffffffff;
      }
      auVar10 = auVar7 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar6 && (iVar11 != iVar6 || auVar10._0_4_ <= auVar5._0_4_)) {
        *(undefined4 *)((long)pIVar1[2].RowBgColor + lVar4 + -0x34) = 0xffffffff;
        *(undefined4 *)((long)pIVar1[3].RowBgColor + lVar4 + -0x34) = 0xffffffff;
      }
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
      lVar4 = lVar4 + 0x960;
    } while ((uVar3 + 3 >> 2) * 0x960 - lVar4 != 0);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}